

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::TryCacheMissingProperty
               (Var instance,Var cacheInstance,bool isRoot,PropertyId propertyId,
               ScriptContext *requestContext,PropertyValueInfo *info)

{
  JavascriptLibrary *pJVar1;
  bool bVar2;
  int iVar3;
  DynamicObject *pDVar4;
  
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015bbe90,MissingPropertyCachePhase);
  if (!bVar2 && !isRoot) {
    bVar2 = DynamicObject::IsBaseDynamicObject(instance);
    if ((!bVar2) && (bVar2 = DynamicObject::IsAnyArray(instance), !bVar2)) {
      return;
    }
    pDVar4 = UnsafeVarTo<Js::DynamicObject>(instance);
    if (((((pDVar4->super_RecyclableObject).type.ptr)->flags & TypeFlagMask_JsrtExternal) ==
         TypeFlagMask_None) ||
       ((requestContext->threadContext->disableImplicitFlags & DisableImplicitCallFlag) ==
        DisableImplicitNoFlag)) {
      pDVar4 = UnsafeVarTo<Js::DynamicObject>(instance);
      iVar3 = (**(code **)(**(long **)((pDVar4->super_RecyclableObject).type.ptr + 1) + 0x270))();
      if (iVar3 != 0) {
        bVar2 = Phases::IsEnabled((Phases *)&DAT_015ca868,MissingPropertyCachePhase);
        if (bVar2) {
          ScriptContext::RecordMissingPropertyCacheAttempt(requestContext);
        }
        bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,MissingPropertyCachePhase);
        if (bVar2) {
          Output::Print(L"MissingPropertyCache: Caching missing property for property %d.\n",
                        (ulong)(uint)propertyId);
        }
        pJVar1 = (requestContext->super_ScriptContextBase).javascriptLibrary;
        if (info != (PropertyValueInfo *)0x0) {
          info->m_instance = &((pJVar1->missingPropertyHolder).ptr)->super_RecyclableObject;
          info->m_propertyIndex = 0;
          info->m_attributes = '\x04';
          info->flags = InlineCacheNoFlags;
        }
        CacheOperators::CachePropertyRead
                  (cacheInstance,&((pJVar1->missingPropertyHolder).ptr)->super_RecyclableObject,
                   false,propertyId,true,info,requestContext);
      }
    }
  }
  return;
}

Assistant:

void JavascriptOperators::TryCacheMissingProperty(Var instance, Var cacheInstance, bool isRoot, PropertyId propertyId, ScriptContext* requestContext, _Inout_ PropertyValueInfo * info)
    {
        // Here, any well-behaved subclasses of DynamicObject can opt in to getting included in the missing property cache.
        // For now, we only include basic objects and arrays. 
        if (PHASE_OFF1(MissingPropertyCachePhase) || isRoot || !(DynamicObject::IsBaseDynamicObject(instance) || DynamicObject::IsAnyArray(instance)))
        {
            return;
        }

        // CustomExternalObject in particular is problematic because in some cases it can report missing when implicit callsare disabled.
        // See CustomExternalObject::GetPropertyQuery for an example.
        if (UnsafeVarTo<DynamicObject>(instance)->GetType()->IsJsrtExternal() && requestContext->GetThreadContext()->IsDisableImplicitCall())
        {
            return;
        }

        DynamicTypeHandler* handler = UnsafeVarTo<DynamicObject>(instance)->GetDynamicType()->GetTypeHandler();

        // Only cache missing property lookups for non-root field loads on objects that have PathTypeHandlers, because only these types have the right behavior
        // when the missing property is later added. DictionaryTypeHandler's introduce the possibility that a stale TypePropertyCache entry with isMissing==true can
        // be left in the cache after the property has been installed in the object's prototype chain. Other changes to optimize accesses to objects that don't
        // override special symbols make it unnecessary to introduce an invalidation scheme to deal with DictionaryTypeHandler's.

        if (!handler->IsPathTypeHandler())
        {
            return;
        }

#ifdef MISSING_PROPERTY_STATS
        if (PHASE_STATS1(MissingPropertyCachePhase))
        {
            requestContext->RecordMissingPropertyCacheAttempt();
        }
#endif
        if (PHASE_TRACE1(MissingPropertyCachePhase))
        {
            Output::Print(_u("MissingPropertyCache: Caching missing property for property %d.\n"), propertyId);
        }

        PropertyValueInfo::Set(info, requestContext->GetLibrary()->GetMissingPropertyHolder(), 0);
        CacheOperators::CachePropertyRead(cacheInstance, requestContext->GetLibrary()->GetMissingPropertyHolder(), isRoot, propertyId, true /*isMissing*/, info, requestContext);
    }